

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O2

void mdct_init(mdct_lookup *lookup,int n)

{
  long lVar1;
  char cVar2;
  int *piVar3;
  float *pfVar4;
  byte bVar5;
  long lVar6;
  ulong uVar7;
  int acc;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  iVar11 = (int)((long)n / 4);
  piVar3 = (int *)malloc((long)iVar11 * 4);
  pfVar4 = (float *)malloc((long)(n + iVar11) << 2);
  dVar13 = log((double)n);
  dVar13 = rint(dVar13 / 0.6931471805599453);
  lookup->log2n = (int)dVar13;
  lookup->n = n;
  lookup->trig = pfVar4;
  lookup->bitrev = piVar3;
  lVar6 = 0;
  uVar12 = (long)n / 4 & 0xffffffff;
  if (iVar11 < 1) {
    uVar12 = 0;
  }
  lVar1 = (long)(n >> 1) * 4;
  iVar11 = 1;
  for (; uVar12 * 4 != lVar6; lVar6 = lVar6 + 4) {
    dVar14 = (double)(int)lVar6 * (3.141592653589793 / (double)n);
    dVar15 = cos(dVar14);
    *(float *)((long)pfVar4 + lVar6 * 2) = (float)dVar15;
    dVar14 = sin(dVar14);
    *(float *)((long)pfVar4 + lVar6 * 2 + 4) = -(float)dVar14;
    dVar14 = (double)iVar11 * (3.141592653589793 / (double)(n * 2));
    dVar15 = cos(dVar14);
    *(float *)((long)pfVar4 + lVar6 * 2 + lVar1) = (float)dVar15;
    dVar14 = sin(dVar14);
    *(float *)((long)pfVar4 + lVar6 * 2 + lVar1 + 4) = (float)dVar14;
    iVar11 = iVar11 + 2;
  }
  uVar7 = 0;
  uVar12 = (long)n / 8 & 0xffffffff;
  if ((int)((long)n / 8) < 1) {
    uVar12 = uVar7;
  }
  for (; uVar12 * 4 - uVar7 != 0; uVar7 = uVar7 + 4) {
    dVar14 = (double)((int)uVar7 + 2) * (3.141592653589793 / (double)n);
    dVar15 = cos(dVar14);
    *(float *)((long)pfVar4 + uVar7 * 2 + (long)n * 4) = (float)(dVar15 * 0.5);
    dVar14 = sin(dVar14);
    *(float *)((long)pfVar4 + uVar7 * 2 + (long)n * 4 + 4) = (float)(dVar14 * -0.5);
  }
  cVar2 = (char)(int)dVar13;
  for (uVar7 = 0; uVar7 != uVar12; uVar7 = uVar7 + 1) {
    uVar8 = 0;
    for (bVar5 = 0; uVar9 = (1 << (cVar2 - 2U & 0x1f)) >> (bVar5 & 0x1f), uVar9 != 0;
        bVar5 = bVar5 + 1) {
      uVar10 = 1 << (bVar5 & 0x1f);
      if ((uVar9 & (uint)uVar7) == 0) {
        uVar10 = 0;
      }
      uVar8 = uVar8 | uVar10;
    }
    piVar3[uVar7 * 2] = -2 - (uVar8 | -1 << (cVar2 - 1U & 0x1f));
    piVar3[uVar7 * 2 + 1] = uVar8;
  }
  lookup->scale = 4.0 / (float)n;
  return;
}

Assistant:

void mdct_init(mdct_lookup *lookup,int n){
  int   *bitrev=_ogg_malloc(sizeof(*bitrev)*(n/4));
  DATA_TYPE *T=_ogg_malloc(sizeof(*T)*(n+n/4));

  int i;
  int n2=n>>1;
  int log2n=lookup->log2n=rint(log((float)n)/log(2.f));
  lookup->n=n;
  lookup->trig=T;
  lookup->bitrev=bitrev;

/* trig lookups... */

  for(i=0;i<n/4;i++){
    T[i*2]=FLOAT_CONV(cos((M_PI/n)*(4*i)));
    T[i*2+1]=FLOAT_CONV(-sin((M_PI/n)*(4*i)));
    T[n2+i*2]=FLOAT_CONV(cos((M_PI/(2*n))*(2*i+1)));
    T[n2+i*2+1]=FLOAT_CONV(sin((M_PI/(2*n))*(2*i+1)));
  }
  for(i=0;i<n/8;i++){
    T[n+i*2]=FLOAT_CONV(cos((M_PI/n)*(4*i+2))*.5);
    T[n+i*2+1]=FLOAT_CONV(-sin((M_PI/n)*(4*i+2))*.5);
  }

  /* bitreverse lookup... */

  {
    int mask=(1<<(log2n-1))-1,i,j;
    int msb=1<<(log2n-2);
    for(i=0;i<n/8;i++){
      int acc=0;
      for(j=0;msb>>j;j++)
        if((msb>>j)&i)acc|=1<<j;
      bitrev[i*2]=((~acc)&mask)-1;
      bitrev[i*2+1]=acc;

    }
  }
  lookup->scale=FLOAT_CONV(4.f/n);
}